

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

D_Sym * update_D_Sym(D_Sym *sym,D_Scope **pst,int sizeof_D_Sym)

{
  D_Scope *pDVar1;
  D_Sym *pDVar2;
  int sizeof_D_Sym_local;
  D_Scope **pst_local;
  D_Sym *sym_local;
  
  pDVar1 = enter_D_Scope(*pst,*pst);
  *pst = pDVar1;
  pDVar2 = update_additional_D_Sym(*pst,sym,sizeof_D_Sym);
  return pDVar2;
}

Assistant:

D_Sym *update_D_Sym(D_Sym *sym, D_Scope **pst, int sizeof_D_Sym) {
  *pst = enter_D_Scope(*pst, *pst);
  return update_additional_D_Sym(*pst, sym, sizeof_D_Sym);
}